

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void google::protobuf::compiler::anon_unknown_0::GatherOccupiedFieldRanges
               (Descriptor *descriptor,
               set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *ranges,vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *nested_messages)

{
  long lVar1;
  Type TVar2;
  iterator iVar3;
  int i;
  long lVar4;
  int i_3;
  FieldDescriptor *this;
  long lVar5;
  Descriptor *nested_desc;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  pair<int,_int> local_70;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *local_68;
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar5 = 0;
  local_68 = nested_messages;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar4 = 0; lVar4 < *(int *)(descriptor + 0x2c); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(descriptor + 0x30);
    local_70.first = *(int *)(lVar1 + 0x38 + lVar5);
    local_70.second = local_70.first + 1;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::_M_insert_unique<std::pair<int,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)ranges,&local_70);
    this = (FieldDescriptor *)(lVar1 + lVar5);
    TVar2 = FieldDescriptor::type(this);
    if (TVar2 == TYPE_GROUP) {
      local_70 = (pair<int,_int>)FieldDescriptor::message_type(this);
      std::
      _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
      ::_M_insert_unique<google::protobuf::Descriptor_const*>
                ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                  *)&local_60,(Descriptor **)&local_70);
    }
    lVar5 = lVar5 + 0xa8;
  }
  for (lVar4 = 0; lVar4 < *(int *)(descriptor + 0x68); lVar4 = lVar4 + 1) {
    local_70.second = *(int *)(*(long *)(descriptor + 0x70) + 4 + lVar4 * 8);
    local_70.first = *(int *)(*(long *)(descriptor + 0x70) + lVar4 * 8);
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::_M_insert_unique<std::pair<int,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)ranges,&local_70);
  }
  for (lVar4 = 0; lVar4 < *(int *)(descriptor + 0x88); lVar4 = lVar4 + 1) {
    local_70.second = *(int *)(*(long *)(descriptor + 0x90) + 4 + lVar4 * 8);
    local_70.first = *(int *)(*(long *)(descriptor + 0x90) + lVar4 * 8);
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::_M_insert_unique<std::pair<int,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)ranges,&local_70);
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(descriptor + 0x48); lVar5 = lVar5 + 1) {
    local_70 = (pair<int,_int>)(*(long *)(descriptor + 0x50) + lVar4);
    iVar3 = std::
            _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::find(&local_60,(key_type *)&local_70);
    if ((_Rb_tree_header *)iVar3._M_node == &local_60._M_impl.super__Rb_tree_header) {
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::push_back(local_68,(value_type *)&local_70);
    }
    else {
      GatherOccupiedFieldRanges((Descriptor *)local_70,ranges,local_68);
    }
    lVar4 = lVar4 + 0xa8;
  }
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void GatherOccupiedFieldRanges(
    const Descriptor* descriptor, std::set<FieldRange>* ranges,
    std::vector<const Descriptor*>* nested_messages) {
  std::set<const Descriptor*> groups;
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* fd = descriptor->field(i);
    ranges->insert(FieldRange(fd->number(), fd->number() + 1));
    if (fd->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(fd->message_type());
    }
  }
  for (int i = 0; i < descriptor->extension_range_count(); ++i) {
    ranges->insert(FieldRange(descriptor->extension_range(i)->start,
                              descriptor->extension_range(i)->end));
  }
  for (int i = 0; i < descriptor->reserved_range_count(); ++i) {
    ranges->insert(FieldRange(descriptor->reserved_range(i)->start,
                              descriptor->reserved_range(i)->end));
  }
  // Handle the nested messages/groups in declaration order to make it
  // post-order strict.
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    const Descriptor* nested_desc = descriptor->nested_type(i);
    if (groups.find(nested_desc) != groups.end()) {
      GatherOccupiedFieldRanges(nested_desc, ranges, nested_messages);
    } else {
      nested_messages->push_back(nested_desc);
    }
  }
}